

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

cmComputeLinkInformation * __thiscall
cmGeneratorTarget::GetLinkInformation(cmGeneratorTarget *this,string *config)

{
  bool bVar1;
  type info_00;
  pointer ppVar2;
  pointer pcVar3;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<cmComputeLinkInformation,_std::default_delete<cmComputeLinkInformation>_>_>_>,_bool>
  pVar4;
  cmGeneratorTarget *local_68;
  unique_ptr<cmComputeLinkInformation,_std::default_delete<cmComputeLinkInformation>_> local_60;
  __single_object info;
  _Self local_40;
  iterator i;
  string key;
  string *config_local;
  cmGeneratorTarget *this_local;
  
  cmsys::SystemTools::UpperCase((string *)&i,config);
  local_40._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<cmComputeLinkInformation,_std::default_delete<cmComputeLinkInformation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<cmComputeLinkInformation,_std::default_delete<cmComputeLinkInformation>_>_>_>_>
       ::find(&this->LinkInformation,(string *)&i);
  info._M_t.
  super___uniq_ptr_impl<cmComputeLinkInformation,_std::default_delete<cmComputeLinkInformation>_>.
  _M_t.
  super__Tuple_impl<0UL,_cmComputeLinkInformation_*,_std::default_delete<cmComputeLinkInformation>_>
  .super__Head_base<0UL,_cmComputeLinkInformation_*,_false>._M_head_impl =
       (__uniq_ptr_data<cmComputeLinkInformation,_std::default_delete<cmComputeLinkInformation>,_true,_true>
        )std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<cmComputeLinkInformation,_std::default_delete<cmComputeLinkInformation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<cmComputeLinkInformation,_std::default_delete<cmComputeLinkInformation>_>_>_>_>
         ::end(&this->LinkInformation);
  bVar1 = std::operator==(&local_40,(_Self *)&info);
  if (bVar1) {
    local_68 = this;
    std::make_unique<cmComputeLinkInformation,cmGeneratorTarget_const*,std::__cxx11::string_const&>
              ((cmGeneratorTarget **)&local_60,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_68);
    bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_60);
    if (bVar1) {
      pcVar3 = std::
               unique_ptr<cmComputeLinkInformation,_std::default_delete<cmComputeLinkInformation>_>
               ::operator->(&local_60);
      bVar1 = cmComputeLinkInformation::Compute(pcVar3);
      if (!bVar1) {
        std::unique_ptr<cmComputeLinkInformation,_std::default_delete<cmComputeLinkInformation>_>::
        reset(&local_60,(pointer)0x0);
      }
    }
    pVar4 = std::
            map<std::__cxx11::string,std::unique_ptr<cmComputeLinkInformation,std::default_delete<cmComputeLinkInformation>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<cmComputeLinkInformation,std::default_delete<cmComputeLinkInformation>>>>>
            ::
            emplace<std::__cxx11::string&,std::unique_ptr<cmComputeLinkInformation,std::default_delete<cmComputeLinkInformation>>>
                      ((map<std::__cxx11::string,std::unique_ptr<cmComputeLinkInformation,std::default_delete<cmComputeLinkInformation>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<cmComputeLinkInformation,std::default_delete<cmComputeLinkInformation>>>>>
                        *)&this->LinkInformation,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i,
                       &local_60);
    local_40._M_node = (_Base_ptr)pVar4.first._M_node;
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<cmComputeLinkInformation,_std::default_delete<cmComputeLinkInformation>_>_>_>
             ::operator->(&local_40);
    bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&ppVar2->second);
    if (bVar1) {
      ppVar2 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<cmComputeLinkInformation,_std::default_delete<cmComputeLinkInformation>_>_>_>
               ::operator->(&local_40);
      info_00 = std::
                unique_ptr<cmComputeLinkInformation,_std::default_delete<cmComputeLinkInformation>_>
                ::operator*(&ppVar2->second);
      CheckPropertyCompatibility(this,info_00,config);
    }
    std::unique_ptr<cmComputeLinkInformation,_std::default_delete<cmComputeLinkInformation>_>::
    ~unique_ptr(&local_60);
  }
  ppVar2 = std::
           _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<cmComputeLinkInformation,_std::default_delete<cmComputeLinkInformation>_>_>_>
           ::operator->(&local_40);
  pcVar3 = std::unique_ptr<cmComputeLinkInformation,_std::default_delete<cmComputeLinkInformation>_>
           ::get(&ppVar2->second);
  std::__cxx11::string::~string((string *)&i);
  return pcVar3;
}

Assistant:

cmComputeLinkInformation* cmGeneratorTarget::GetLinkInformation(
  const std::string& config) const
{
  // Lookup any existing information for this configuration.
  std::string key(cmSystemTools::UpperCase(config));
  auto i = this->LinkInformation.find(key);
  if (i == this->LinkInformation.end()) {
    // Compute information for this configuration.
    auto info = cm::make_unique<cmComputeLinkInformation>(this, config);
    if (info && !info->Compute()) {
      info.reset();
    }

    // Store the information for this configuration.
    i = this->LinkInformation.emplace(key, std::move(info)).first;

    if (i->second) {
      this->CheckPropertyCompatibility(*i->second, config);
    }
  }
  return i->second.get();
}